

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

void jsonip::detail::stl_pushbackable_helper<std::vector<P,std::allocator<P>>>::
     write<jsonip::writer<false>>(writer<false> *w,vector<P,_std::allocator<P>_> *t)

{
  bool bVar1;
  reference t_00;
  __normal_iterator<const_P_*,_std::vector<P,_std::allocator<P>_>_> local_28;
  __normal_iterator<const_P_*,_std::vector<P,_std::allocator<P>_>_> local_20;
  const_iterator it;
  vector<P,_std::allocator<P>_> *t_local;
  writer<false> *w_local;
  
  it._M_current = (P *)t;
  writer<false>::array_start(w);
  local_20._M_current = (P *)std::vector<P,_std::allocator<P>_>::begin(it._M_current);
  while( true ) {
    local_28._M_current = (P *)std::vector<P,_std::allocator<P>_>::end(it._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    t_00 = __gnu_cxx::__normal_iterator<const_P_*,_std::vector<P,_std::allocator<P>_>_>::operator*
                     (&local_20);
    struct_helper<P>::write<jsonip::writer<false>>(w,t_00);
    __gnu_cxx::__normal_iterator<const_P_*,_std::vector<P,_std::allocator<P>_>_>::operator++
              (&local_20);
  }
  writer<false>::array_end(w);
  return;
}

Assistant:

static void write(Writer& w, const T& t)
        {
            w.array_start();
            for (typename T::const_iterator it = t.begin(); it != t.end(); ++it)
            {
                slice_helper::type::write(w, *it);
            }
            w.array_end();
        }